

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSGDiscrete.cpp
# Opt level: O2

void __thiscall POSGDiscrete::SoftPrint_abi_cxx11_(POSGDiscrete *this)

{
  long *in_RSI;
  
  SoftPrint_abi_cxx11_((string *)this,(POSGDiscrete *)((long)in_RSI + *(long *)(*in_RSI + -0x180)));
  return;
}

Assistant:

string POSGDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << MultiAgentDecisionProcessDiscrete::SoftPrint();
    ss << POSG::SoftPrint();

    if(_m_initialized)
    {
        for(Index agentI = 0; agentI < GetNrAgents(); agentI++)
        {
            ss << "Reward model for agent "<<agentI<<": " << endl;
            ss << _m_p_rModel.at(agentI)->SoftPrint() << endl;
        }
    }
    else
        throw E("POSGDiscrete components (reward model) not initialized");

    return(ss.str());
}